

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int stbtt__matchpair(stbtt_uint8 *fc,stbtt_uint32 nm,stbtt_uint8 *name,stbtt_int32 nlen,
                    stbtt_int32 target_id,stbtt_int32 next_id)

{
  stbtt_uint16 sVar1;
  stbtt_uint16 sVar2;
  stbtt_uint16 sVar3;
  stbtt_uint16 sVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  stbtt_int32 sVar9;
  int iVar10;
  int in_ECX;
  stbtt_uint8 *in_RDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  stbtt_int32 matchlen;
  stbtt_int32 off;
  stbtt_int32 slen;
  stbtt_int32 language;
  stbtt_int32 encoding;
  stbtt_int32 platform;
  stbtt_int32 id;
  stbtt_uint32 loc;
  stbtt_int32 stringOffset;
  stbtt_int32 count;
  stbtt_int32 i;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar11;
  int local_30;
  
  sVar1 = ttUSHORT((stbtt_uint8 *)(in_RDI + (ulong)in_ESI + 2));
  uVar11 = in_ESI;
  sVar2 = ttUSHORT((stbtt_uint8 *)(in_RDI + (ulong)in_ESI + 4));
  iVar5 = uVar11 + sVar2;
  local_30 = 0;
  do {
    if ((int)(uint)sVar1 <= local_30) {
      return 0;
    }
    uVar6 = in_ESI + 6 + local_30 * 0xc;
    sVar2 = ttUSHORT((stbtt_uint8 *)(in_RDI + (ulong)uVar6 + 6));
    if (sVar2 == in_R8D) {
      sVar2 = ttUSHORT((stbtt_uint8 *)(in_RDI + (ulong)uVar6));
      sVar3 = ttUSHORT((stbtt_uint8 *)(in_RDI + (ulong)uVar6 + 2));
      sVar4 = ttUSHORT((stbtt_uint8 *)(in_RDI + (ulong)uVar6 + 4));
      uVar7 = (uint)sVar4;
      if (((sVar2 == 0) || ((sVar2 == 3 && (sVar3 == 1)))) || ((sVar2 == 3 && (sVar3 == 10)))) {
        sVar4 = ttUSHORT((stbtt_uint8 *)(in_RDI + (ulong)uVar6 + 8));
        uVar8 = (uint)sVar4;
        sVar4 = ttUSHORT((stbtt_uint8 *)(in_RDI + (ulong)uVar6 + 10));
        sVar9 = stbtt__CompareUTF8toUTF16_bigendian_prefix
                          (in_RDX,in_ECX,(stbtt_uint8 *)(in_RDI + iVar5 + (long)(int)(uint)sVar4),
                           uVar8);
        if (-1 < sVar9) {
          if ((((local_30 + 1 < (int)(uint)sVar1) &&
               (sVar4 = ttUSHORT((stbtt_uint8 *)(in_RDI + (ulong)uVar6 + 0x12)), sVar4 == in_R9D))
              && (sVar4 = ttUSHORT((stbtt_uint8 *)(in_RDI + (ulong)uVar6 + 0xc)), sVar4 == sVar2))
             && ((sVar2 = ttUSHORT((stbtt_uint8 *)(in_RDI + (ulong)uVar6 + 0xe)), sVar2 == sVar3 &&
                 (sVar2 = ttUSHORT((stbtt_uint8 *)(in_RDI + (ulong)uVar6 + 0x10)), sVar2 == uVar7)))
             ) {
            sVar2 = ttUSHORT((stbtt_uint8 *)(in_RDI + (ulong)uVar6 + 0x14));
            uVar8 = (uint)sVar2;
            sVar2 = ttUSHORT((stbtt_uint8 *)(in_RDI + (ulong)uVar6 + 0x16));
            if (uVar8 == 0) {
              if (sVar9 == in_ECX) {
                return 1;
              }
            }
            else if (((sVar9 < in_ECX) && (in_RDX[sVar9] == ' ')) &&
                    (iVar10 = stbtt_CompareUTF8toUTF16_bigendian_internal
                                        ((char *)CONCAT44(uVar7,uVar8),(uint)sVar2,
                                         (char *)CONCAT44(uVar11,in_stack_ffffffffffffffa0),
                                         in_stack_ffffffffffffff9c), iVar10 != 0)) {
              return 1;
            }
          }
          else if (sVar9 == in_ECX) {
            return 1;
          }
        }
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static int stbtt__matchpair(stbtt_uint8 *fc, stbtt_uint32 nm, stbtt_uint8 *name, stbtt_int32 nlen, stbtt_int32 target_id, stbtt_int32 next_id)
{
stbtt_int32 i;
stbtt_int32 count = ttUSHORT(fc+nm+2);
stbtt_int32 stringOffset = nm + ttUSHORT(fc+nm+4);

for (i=0; i < count; ++i) {
stbtt_uint32 loc = nm + 6 + 12 * i;
stbtt_int32 id = ttUSHORT(fc+loc+6);
if (id == target_id) {
/*  find the encoding */
stbtt_int32 platform = ttUSHORT(fc+loc+0), encoding = ttUSHORT(fc+loc+2), language = ttUSHORT(fc+loc+4);

/*  is this a Unicode encoding? */
if (platform == 0 || (platform == 3 && encoding == 1) || (platform == 3 && encoding == 10)) {
stbtt_int32 slen = ttUSHORT(fc+loc+8);
stbtt_int32 off = ttUSHORT(fc+loc+10);

/*  check if there's a prefix match */
stbtt_int32 matchlen = stbtt__CompareUTF8toUTF16_bigendian_prefix(name, nlen, fc+stringOffset+off,slen);
if (matchlen >= 0) {
/*  check for target_id+1 immediately following, with same encoding & language */
if (i+1 < count && ttUSHORT(fc+loc+12+6) == next_id && ttUSHORT(fc+loc+12) == platform && ttUSHORT(fc+loc+12+2) == encoding && ttUSHORT(fc+loc+12+4) == language) {
slen = ttUSHORT(fc+loc+12+8);
off = ttUSHORT(fc+loc+12+10);
if (slen == 0) {
if (matchlen == nlen)
return 1;
} else if (matchlen < nlen && name[matchlen] == ' ') {
++matchlen;
if (stbtt_CompareUTF8toUTF16_bigendian_internal((char*) (name+matchlen), nlen-matchlen, (char*)(fc+stringOffset+off),slen))
return 1;
}
} else {
/*  if nothing immediately following */
if (matchlen == nlen)
return 1;
}
}
}

/*  @TODO handle other encodings */
}
}
return 0;
}